

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O0

TimingControl *
slang::ast::SignalEventControl::fromSyntax
          (Compilation *compilation,SimpleSequenceExprSyntax *syntax,ASTContext *context)

{
  SourceRange sourceRange;
  int iVar1;
  ExpressionSyntax *l;
  bitmask<slang::ast::ASTFlags> bVar2;
  undefined4 extraout_var;
  sockaddr *in_RDX;
  long in_RSI;
  Expression *expr;
  ASTContext *in_stack_00000068;
  Expression *in_stack_00000070;
  undefined1 in_stack_000000a0 [16];
  TimingControl *in_stack_ffffffffffffff68;
  Compilation *in_stack_ffffffffffffff70;
  ASTContext *in_stack_ffffffffffffff88;
  SourceLocation in_stack_ffffffffffffff90;
  SourceLocation in_stack_ffffffffffffff98;
  SyntaxNode *in_stack_ffffffffffffffc0;
  undefined8 local_8;
  
  if (*(long *)(in_RSI + 0x20) == 0) {
    l = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                  ((not_null<slang::syntax::ExpressionSyntax_*> *)0x4bfefd);
    bVar2 = ast::operator|((ASTFlags)l,(ASTFlags)in_stack_ffffffffffffff70);
    iVar1 = Expression::bind((int)l,in_RDX,(socklen_t)bVar2.m_bits);
    slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)CONCAT44(extraout_var,iVar1));
    local_8 = fromExpr(compilation,syntax._4_4_,(Expression *)context,in_stack_00000070,
                       in_stack_00000068,(SourceRange)in_stack_000000a0);
  }
  else {
    slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffffc0);
    sourceRange.endLoc = in_stack_ffffffffffffff98;
    sourceRange.startLoc = in_stack_ffffffffffffff90;
    ASTContext::addDiag(in_stack_ffffffffffffff88,SUB84((ulong)in_RDX >> 0x20,0),sourceRange);
    local_8 = TimingControl::badCtrl(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  return local_8;
}

Assistant:

TimingControl& SignalEventControl::fromSyntax(Compilation& compilation,
                                              const SimpleSequenceExprSyntax& syntax,
                                              const ASTContext& context) {
    if (syntax.repetition) {
        context.addDiag(diag::InvalidSyntaxInEventExpr, syntax.sourceRange());
        return badCtrl(compilation, nullptr);
    }

    auto& expr = Expression::bind(*syntax.expr, context,
                                  ASTFlags::EventExpression | ASTFlags::AllowClockingBlock);

    return fromExpr(compilation, EdgeKind::None, expr, nullptr, context, syntax.sourceRange());
}